

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

QString * __thiscall QComboBox::currentText(QString *__return_storage_ptr__,QComboBox *this)

{
  QComboBoxPrivate *this_00;
  char cVar1;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  if (this_00->lineEdit == (QLineEdit *)0x0) {
    cVar1 = QPersistentModelIndex::isValid();
    if (cVar1 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_003d79ea;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40,&this_00->currentIndex);
      QComboBoxPrivate::itemText(__return_storage_ptr__,this_00,&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_003d79ea:
        __stack_chk_fail();
      }
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_003d79ea;
    QLineEdit::text(__return_storage_ptr__,this_00->lineEdit);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QComboBox::currentText() const
{
    Q_D(const QComboBox);
    if (d->lineEdit)
        return d->lineEdit->text();
    if (d->currentIndex.isValid())
        return d->itemText(d->currentIndex);
    return {};
}